

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O0

bool test_Dice(void)

{
  void *pvVar1;
  int e;
  Dice *dice;
  
  pvVar1 = operator_new(1);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,1);
  }
  return true;
}

Assistant:

bool test_Dice() {
    try {
        Dice* dice = new Dice();
        delete (dice);
        return true;
    }
    catch (int e) {
        return false;
    }
}